

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall
de::Random::
shuffle<__gnu_cxx::__normal_iterator<std::pair<int,tcu::CubeFace>*,std::vector<std::pair<int,tcu::CubeFace>,std::allocator<std::pair<int,tcu::CubeFace>>>>>
          (Random *this,
          __normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
          first,__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
                last)

{
  pair<int,_tcu::CubeFace> pVar1;
  int iVar2;
  uint max;
  ulong uVar3;
  
  uVar3 = (ulong)((long)last._M_current - (long)first._M_current) >> 3 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    max = (uint)uVar3;
    if ((int)max < 1) break;
    iVar2 = getInt(this,0,max);
    pVar1 = first._M_current[max & 0x7fffffff];
    first._M_current[max & 0x7fffffff] = first._M_current[iVar2];
    first._M_current[iVar2] = pVar1;
  }
  return;
}

Assistant:

void Random::shuffle (Iterator first, Iterator last)
{
	using std::swap;

	// Fisher-Yates suffle
	int numItems = (int)std::distance(first, last);

	for (int i = numItems-1; i >= 1; i--)
	{
		int j = getInt(0, i);
		swap(*(first + i), *(first + j));
	}
}